

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsCommon.cpp
# Opt level: O0

bool helics::tcp::commErrorHandler(CommsInterface *comm,TcpConnection *param_2,error_code *error)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  CommsInterface *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  error_code *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uint7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff40;
  string_view in_stack_ffffffffffffff48;
  
  bVar1 = CommsInterface::isConnected(in_stack_fffffffffffffed0);
  if (bVar1) {
    this = in_RDX;
    std::error_code::error_code<asio::error::misc_errors,void>
              ((error_code *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (misc_errors)((ulong)in_RDX >> 0x20));
    bVar1 = std::operator==((error_code *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    bVar2 = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffee0 = in_RDX;
      std::error_code::error_code<asio::error::basic_errors,void>
                ((error_code *)(ulong)in_stack_fffffffffffffef0,(basic_errors)((ulong)this >> 0x20))
      ;
      bVar1 = std::operator==((error_code *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      bVar2 = bVar1 ^ 0xff;
    }
    if ((bVar2 & 1) != 0) {
      __lhs = in_RDX;
      std::error_code::error_code<asio::error::basic_errors,void>
                ((error_code *)CONCAT17(bVar2,in_stack_fffffffffffffef0),
                 (basic_errors)((ulong)this >> 0x20));
      bVar1 = std::operator==((error_code *)in_stack_fffffffffffffee0,(error_code *)__lhs);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &stack0xffffffffffffff28;
        std::error_code::message_abi_cxx11_((error_code *)this);
        std::operator+((char *)__lhs,__rhs);
        std::operator+(__lhs,(char *)__rhs);
        std::error_code::value((error_code *)in_RDX);
        CLI::std::__cxx11::to_string(in_stack_ffffffffffffff1c);
        std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        std::__cxx11::string::operator_cast_to_basic_string_view(__rhs);
        CommsInterface::logError
                  ((CommsInterface *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      }
    }
  }
  return false;
}

Assistant:

bool commErrorHandler(CommsInterface* comm,
                          gmlc::networking::TcpConnection* /*connection*/,
                          const std::error_code& error)
    {
        if (comm->isConnected()) {
            if ((error != asio::error::eof) && (error != asio::error::operation_aborted)) {
                if (error != asio::error::connection_reset) {
                    comm->logError("error message while connected " + error.message() + "code " +
                                   std::to_string(error.value()));
                }
            }
        }
        return false;
    }